

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O2

vector<long,_std::allocator<long>_> * __thiscall
SequenceDistanceGraph::oldnames_to_nodes
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,SequenceDistanceGraph *this,
          string *_oldnames)

{
  byte *pbVar1;
  byte bVar2;
  mapped_type *pmVar3;
  invalid_argument *piVar4;
  byte *pbVar5;
  long lVar6;
  sgNodeID_t node;
  string oldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar5 = (byte *)(_oldnames->_M_dataplus)._M_p;
  oldname._M_dataplus._M_p = (pointer)&oldname.field_2;
  oldname._M_string_length = 0;
  oldname.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar2 = *pbVar5;
    if (bVar2 == 0) {
      std::__cxx11::string::~string((string *)&oldname);
      return __return_storage_ptr__;
    }
    lVar6 = 0;
    pbVar1 = pbVar5;
    while ((pbVar5 = pbVar1 + 1, 0x2d < bVar2 ||
           ((0x280000000001U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
      bVar2 = *pbVar5;
      lVar6 = lVar6 + 1;
      pbVar1 = pbVar5;
    }
    if ((bVar2 == 0) || (lVar6 == 0)) break;
    std::__cxx11::string::assign((char *)&oldname);
    std::__cxx11::string::resize((ulong)&oldname);
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->oldnames_to_ids,&oldname);
    node = *pmVar3;
    if (node == 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_70,"node ",&oldname);
      std::operator+(&local_50,&local_70," doesn\'t exist in graph");
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_50);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (*pbVar1 == 0x2d) {
      node = -node;
    }
    std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,&node);
    if (*pbVar5 == 0x2c) {
      pbVar5 = pbVar1 + 2;
    }
    else if (*pbVar5 != 0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar4,"invalid path specification");
LAB_001c0bbe:
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"invalid path specification");
  goto LAB_001c0bbe;
}

Assistant:

std::vector<sgNodeID_t> SequenceDistanceGraph::oldnames_to_nodes(std::string _oldnames) {
    std::vector<sgNodeID_t> nv;
    const char * s = _oldnames.c_str();
    const char * sign;
    std::string oldname;
    sgNodeID_t node;
    while (*s!= NULL){
        for (sign=s;*sign!=NULL and *sign !='+' and *sign!='-';++sign);
        if (sign ==s or *sign==NULL ) throw std::invalid_argument("invalid path specification");
        oldname=s;
        oldname.resize(sign-s);
        node=oldnames_to_ids[oldname];
        if (0==node) throw std::invalid_argument("node "+oldname+" doesn't exist in graph");
        if (*sign=='-') node=-node;
        nv.push_back(node);
        s=sign+1;
        if (*s==',') ++s;
        else if (*s!=NULL) throw std::invalid_argument("invalid path specification");

    }
    return nv;
}